

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void Am_Print_Key(ostream *os,Am_Slot_Key key)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"<",1);
  __s = Am_Get_Slot_Name(key);
  if (__s == (char *)0x0) {
    __s = "unnamed";
    sVar1 = 7;
  }
  else {
    sVar1 = strlen(__s);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  poVar2 = (ostream *)std::ostream::operator<<(os,(uint)key);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]>",2);
  return;
}

Assistant:

void
Am_Print_Key(std::ostream &os, Am_Slot_Key key)
{
  os << "<";
  const char *name = Am_Get_Slot_Name(key);
  if (name)
    os << name;
  else
    os << "unnamed";
  os << "[" << (int)key << "]>";
}